

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft2d.c
# Opt level: O0

int fft3dInit(long L,long M2,long M)

{
  float *pfVar1;
  long in_RSI;
  ulong in_RDI;
  int theError;
  int local_1c;
  
  local_1c = 1;
  if ((-1 < (long)in_RDI) && (in_RDI < 0x40)) {
    local_1c = 0;
    if (Array2d[in_RDI] == (float *)0x0) {
      pfVar1 = (float *)malloc((1L << ((byte)in_RDI & 0x3f)) << 5);
      Array2d[in_RDI] = pfVar1;
      if (Array2d[in_RDI] == (float *)0x0) {
        local_1c = 2;
      }
      else {
        local_1c = fftInit(in_RSI);
      }
    }
    if ((local_1c == 0) && (Array2d[in_RSI] == (float *)0x0)) {
      pfVar1 = (float *)malloc((1L << ((byte)in_RSI & 0x3f)) << 5);
      Array2d[in_RSI] = pfVar1;
      if (Array2d[in_RSI] == (float *)0x0) {
        local_1c = 2;
      }
      else {
        local_1c = fftInit(in_RSI);
      }
    }
    if (local_1c == 0) {
      local_1c = fftInit(in_RSI);
    }
  }
  return local_1c;
}

Assistant:

int fft3dInit(long L, long M2, long M){
	// init for fft3d, ifft3d
	// malloc storage for 4 columns and 4 pages of 3d ffts
	// then call fftinit for page, row and column ffts sizes
//* M = log2 of number of columns */
/* M2 = log2 of number of rows */
/* L = log2 of number of pages */
/*       of 3d matrix to be fourier transformed */
/* OUTPUTS */
/* private storage for columns and pages of 3d ffts	*/
/* calls fftInit for cosine and bit reversed tables	*/
int theError = 1;
if ((L >= 0) && (L < 8*sizeof(long))){
	theError = 0;
	if (Array2d[L] == 0){
		Array2d[L] = (float *) malloc( 4*2*POW2(L)*sizeof(float) );
		if (Array2d[L] == 0)
			theError = 2;
		else{
			theError = fftInit(L);
		}
	}
	if (theError == 0){
		if (Array2d[M2] == 0){
			Array2d[M2] = (float *) malloc( 4*2*POW2(M2)*sizeof(float) );
			if (Array2d[M2] == 0)
				theError = 2;
			else{
				theError = fftInit(M2);
			}
		}
	}
	if (theError == 0)
		theError = fftInit(M);
}
return theError;
}